

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gelu_x86.cpp
# Opt level: O2

int __thiscall ncnn::GELU_x86::forward_inplace(GELU_x86 *this,Mat *bottom_top_blob,Option *opt)

{
  float fVar1;
  void *pvVar2;
  size_t sVar3;
  size_t sVar4;
  float fVar5;
  float fVar6;
  long lVar7;
  float *pfVar8;
  int iVar9;
  int iVar10;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  float fVar14;
  float fVar15;
  float fVar19;
  float fVar20;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  float fVar21;
  undefined1 auVar18 [16];
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  
  if ((this->super_GELU).fast_gelu != 0) {
    iVar9 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d * bottom_top_blob->elempack
    ;
    uVar13 = 0;
    uVar12 = (ulong)(uint)bottom_top_blob->c;
    if (bottom_top_blob->c < 1) {
      uVar12 = uVar13;
    }
    for (; uVar13 != uVar12; uVar13 = uVar13 + 1) {
      pvVar2 = bottom_top_blob->data;
      sVar3 = bottom_top_blob->elemsize;
      sVar4 = bottom_top_blob->cstep;
      pfVar8 = (float *)(sVar4 * uVar13 * sVar3 + (long)pvVar2);
      lVar11 = 0;
      for (iVar10 = 0; iVar10 + 3 < iVar9; iVar10 = iVar10 + 4) {
        fVar1 = *pfVar8;
        fVar14 = pfVar8[1];
        fVar5 = pfVar8[2];
        fVar6 = pfVar8[3];
        auVar16._0_4_ = (fVar1 * fVar1 * 0.044715 * fVar1 + fVar1) * 0.7978845;
        auVar16._4_4_ = (fVar14 * fVar14 * 0.044715 * fVar14 + fVar14) * 0.7978845;
        auVar16._8_4_ = (fVar5 * fVar5 * 0.044715 * fVar5 + fVar5) * 0.7978845;
        auVar16._12_4_ = (fVar6 * fVar6 * 0.044715 * fVar6 + fVar6) * 0.7978845;
        auVar17 = maxps(auVar16,_DAT_00543c40);
        auVar17 = minps(auVar17,_DAT_00543c50);
        fVar15 = auVar17._0_4_;
        fVar19 = auVar17._4_4_;
        fVar20 = auVar17._8_4_;
        fVar21 = auVar17._12_4_;
        fVar22 = fVar15 * fVar15;
        fVar23 = fVar19 * fVar19;
        fVar24 = fVar20 * fVar20;
        fVar25 = fVar21 * fVar21;
        auVar17._0_4_ =
             ((((((fVar22 * -2.7607684e-16 + 2.000188e-13) * fVar22 + -8.604672e-11) * fVar22 +
                5.1222973e-08) * fVar22 + 1.48572235e-05) * fVar22 + 0.00063726195) * fVar22 +
             0.0048935246) * fVar15;
        auVar17._4_4_ =
             ((((((fVar23 * -2.7607684e-16 + 2.000188e-13) * fVar23 + -8.604672e-11) * fVar23 +
                5.1222973e-08) * fVar23 + 1.48572235e-05) * fVar23 + 0.00063726195) * fVar23 +
             0.0048935246) * fVar19;
        auVar17._8_4_ =
             ((((((fVar24 * -2.7607684e-16 + 2.000188e-13) * fVar24 + -8.604672e-11) * fVar24 +
                5.1222973e-08) * fVar24 + 1.48572235e-05) * fVar24 + 0.00063726195) * fVar24 +
             0.0048935246) * fVar20;
        auVar17._12_4_ =
             ((((((fVar25 * -2.7607684e-16 + 2.000188e-13) * fVar25 + -8.604672e-11) * fVar25 +
                5.1222973e-08) * fVar25 + 1.48572235e-05) * fVar25 + 0.00063726195) * fVar25 +
             0.0048935246) * fVar21;
        auVar18._0_4_ =
             ((fVar22 * 1.1982584e-06 + 0.00011853471) * fVar22 + 0.0022684347) * fVar22 +
             0.0048935246;
        auVar18._4_4_ =
             ((fVar23 * 1.1982584e-06 + 0.00011853471) * fVar23 + 0.0022684347) * fVar23 +
             0.0048935246;
        auVar18._8_4_ =
             ((fVar24 * 1.1982584e-06 + 0.00011853471) * fVar24 + 0.0022684347) * fVar24 +
             0.0048935246;
        auVar18._12_4_ =
             ((fVar25 * 1.1982584e-06 + 0.00011853471) * fVar25 + 0.0022684347) * fVar25 +
             0.0048935246;
        auVar17 = divps(auVar17,auVar18);
        *pfVar8 = fVar1 * 0.5 * (auVar17._0_4_ + 1.0);
        pfVar8[1] = fVar14 * 0.5 * (auVar17._4_4_ + 1.0);
        pfVar8[2] = fVar5 * 0.5 * (auVar17._8_4_ + 1.0);
        pfVar8[3] = fVar6 * 0.5 * (auVar17._12_4_ + 1.0);
        pfVar8 = pfVar8 + 4;
        lVar11 = lVar11 + 4;
      }
      lVar7 = sVar4 * sVar3 * uVar13;
      for (; (int)lVar11 < iVar9; lVar11 = lVar11 + 1) {
        fVar1 = *(float *)((long)pvVar2 + lVar11 * 4 + lVar7);
        fVar14 = tanhf((fVar1 * fVar1 * 0.044715 * fVar1 + fVar1) * 0.7978845);
        *(float *)((long)pvVar2 + lVar11 * 4 + lVar7) = (fVar14 + 1.0) * fVar1 * 0.5;
      }
    }
    return 0;
  }
  iVar9 = GELU::forward_inplace(&this->super_GELU,bottom_top_blob,opt);
  return iVar9;
}

Assistant:

int GELU_x86::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    if (!fast_gelu)
    {
        return GELU::forward_inplace(bottom_top_blob, opt);
    }

    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int d = bottom_top_blob.d;
    int elempack = bottom_top_blob.elempack;
    int channels = bottom_top_blob.c;
    int size = w * h * d * elempack;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        int i = 0;

#if __SSE2__
#if __AVX__
#if __AVX512F__
        __m512 _half512 = _mm512_set1_ps(0.5f);
        __m512 _one512 = _mm512_set1_ps(1.f);
        __m512 _fast1c512 = _mm512_set1_ps(0.79788452f);
        __m512 _fast2c512 = _mm512_set1_ps(0.044715f);
        for (; i + 15 < size; i += 16)
        {
            __m512 _pLoad = _mm512_loadu_ps(ptr);

            __m512 _cube = _mm512_mul_ps(_pLoad, _pLoad);
            _cube = _mm512_mul_ps(_pLoad, _cube);

            __m512 _blob = _mm512_mul_ps(_fast2c512, _cube);
            _blob = _mm512_add_ps(_pLoad, _blob);
            _blob = _mm512_mul_ps(_fast1c512, _blob);
            _blob = tanh512_ps(_blob);
            _blob = _mm512_add_ps(_one512, _blob);

            _blob = _mm512_mul_ps(_half512, _mm512_mul_ps(_blob, _pLoad));

            _mm512_storeu_ps(ptr, _blob);

            ptr += 16;
        }
#endif // __AVX512F__
        __m256 _half256 = _mm256_set1_ps(0.5f);
        __m256 _one256 = _mm256_set1_ps(1.f);
        __m256 _fast1c256 = _mm256_set1_ps(0.79788452f);
        __m256 _fast2c256 = _mm256_set1_ps(0.044715f);
        for (; i + 7 < size; i += 8)
        {
            __m256 _pLoad = _mm256_loadu_ps(ptr);

            __m256 _cube = _mm256_mul_ps(_pLoad, _pLoad);
            _cube = _mm256_mul_ps(_pLoad, _cube);

            __m256 _blob = _mm256_mul_ps(_fast2c256, _cube);
            _blob = _mm256_add_ps(_pLoad, _blob);
            _blob = _mm256_mul_ps(_fast1c256, _blob);
            _blob = tanh256_ps(_blob);
            _blob = _mm256_add_ps(_one256, _blob);

            _blob = _mm256_mul_ps(_half256, _mm256_mul_ps(_blob, _pLoad));

            _mm256_storeu_ps(ptr, _blob);

            ptr += 8;
        }
#endif // __AVX__
        __m128 _half128 = _mm_set1_ps(0.5f);
        __m128 _one128 = _mm_set1_ps(1.f);
        __m128 _fast1c128 = _mm_set1_ps(0.79788452f);
        __m128 _fast2c128 = _mm_set1_ps(0.044715f);
        for (; i + 3 < size; i += 4)
        {
            __m128 _pLoad = _mm_loadu_ps(ptr);

            __m128 _cube = _mm_mul_ps(_pLoad, _pLoad);
            _cube = _mm_mul_ps(_pLoad, _cube);

            __m128 _blob = _mm_mul_ps(_fast2c128, _cube);
            _blob = _mm_add_ps(_pLoad, _blob);
            _blob = _mm_mul_ps(_fast1c128, _blob);
            _blob = tanh_ps(_blob);
            _blob = _mm_add_ps(_one128, _blob);

            _blob = _mm_mul_ps(_half128, _mm_mul_ps(_blob, _pLoad));

            _mm_storeu_ps(ptr, _blob);

            ptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            // y = 0.5x * (1 + tanh(sqrt(2/Pi) * (x + 0.044715x^3)))
            *ptr = 0.5f * *ptr * (1.0f + tanhf(0.79788452f * (*ptr + 0.044715f * *ptr * *ptr * *ptr)));

            ptr++;
        }
    }

    return 0;
}